

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Segment::Init(Segment *this,IMkvWriter *ptr_writer)

{
  long in_RSI;
  long in_RDI;
  SegmentInfo *in_stack_00000108;
  undefined1 local_1;
  
  if (in_RSI == 0) {
    local_1 = false;
  }
  else {
    *(long *)(in_RDI + 0x978) = in_RSI;
    *(long *)(in_RDI + 0x980) = in_RSI;
    *(long *)(in_RDI + 0x988) = in_RSI;
    memset((void *)(in_RDI + 0x548),0,0x3f0);
    memset((void *)(in_RDI + 0x158),0,0x3f0);
    local_1 = SegmentInfo::Init(in_stack_00000108);
  }
  return local_1;
}

Assistant:

bool Segment::Init(IMkvWriter* ptr_writer) {
  if (!ptr_writer) {
    return false;
  }
  writer_cluster_ = ptr_writer;
  writer_cues_ = ptr_writer;
  writer_header_ = ptr_writer;
  memset(&track_frames_written_, 0,
         sizeof(track_frames_written_[0]) * kMaxTrackNumber);
  memset(&last_track_timestamp_, 0,
         sizeof(last_track_timestamp_[0]) * kMaxTrackNumber);
  return segment_info_.Init();
}